

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ResultBuilder * __thiscall
Catch::ExpressionLhs<std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>const&>::
captureExpression<(Catch::Internal::Operator)0,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>
          (ExpressionLhs<const_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_&> *this,
          vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *rhs)

{
  bool result;
  char *pcVar1;
  ResultBuilder *pRVar2;
  undefined8 *in_RDI;
  string *in_stack_ffffffffffffff28;
  ResultBuilder *in_stack_ffffffffffffff30;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_ffffffffffffff48;
  allocator local_81;
  string local_80 [32];
  string local_60 [48];
  string local_30 [48];
  
  pRVar2 = (ResultBuilder *)*in_RDI;
  result = Internal::
           compare<(Catch::Internal::Operator)0,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>
                     ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                      in_stack_ffffffffffffff30,
                      (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                      in_stack_ffffffffffffff28);
  ResultBuilder::setResultType(pRVar2,result);
  toString<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>(in_stack_ffffffffffffff48);
  ResultBuilder::setLhs(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  toString<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>(in_stack_ffffffffffffff48);
  ResultBuilder::setRhs(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  pcVar1 = Internal::OperatorTraits<(Catch::Internal::Operator)0>::getName();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,pcVar1,&local_81);
  pRVar2 = ResultBuilder::setOp(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_30);
  return pRVar2;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }